

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::zero_generator_inputs(Generator *top)

{
  undefined1 local_58 [8];
  ZeroGeneratorInputVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  ZeroGeneratorInputVisitor::ZeroGeneratorInputVisitor((ZeroGeneratorInputVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  ZeroGeneratorInputVisitor::~ZeroGeneratorInputVisitor((ZeroGeneratorInputVisitor *)local_58);
  return;
}

Assistant:

void zero_generator_inputs(Generator* top) {
    ZeroGeneratorInputVisitor visitor;
    visitor.visit_generator_root_p(top);
}